

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O2

la_int64_t archive_write_disk_uid(archive *_a,char *name,la_int64_t id)

{
  int iVar1;
  la_int64_t lVar2;
  
  iVar1 = __archive_check_magic(_a,0xc001b0c5,0x7fff,"archive_write_disk_uid");
  if (iVar1 == -0x1e) {
    id = -0x1e;
  }
  else if (_a[1].sconv != (archive_string_conv *)0x0) {
    lVar2 = (*(code *)_a[1].sconv)(_a[1].read_data_offset,name,id);
    return lVar2;
  }
  return id;
}

Assistant:

int64_t
archive_write_disk_uid(struct archive *_a, const char *name, la_int64_t id)
{
	struct archive_write_disk *a = (struct archive_write_disk *)_a;
	archive_check_magic(&a->archive, ARCHIVE_WRITE_DISK_MAGIC,
	    ARCHIVE_STATE_ANY, "archive_write_disk_uid");
	if (a->lookup_uid)
		return (a->lookup_uid)(a->lookup_uid_data, name, id);
	return (id);
}